

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void grabMouseForWidget(QWidget *widget,QCursor *cursor)

{
  long lVar1;
  QWidget *pQVar2;
  
  if (qt_mouseGrb != (QWidget *)0x0) {
    QWidget::releaseMouse(qt_mouseGrb);
  }
  mouseGrabWithCursor = 0;
  lVar1 = *(long *)(*(long *)&widget->field_0x8 + 0x78);
  if (lVar1 == 0) {
    lVar1 = 0;
  }
  else {
    lVar1 = *(long *)(lVar1 + 8);
  }
  if (lVar1 == 0) {
    lVar1 = 0;
  }
  else {
    lVar1 = *(long *)(lVar1 + 0x20);
  }
  if (lVar1 == 0) {
    lVar1 = 0;
    pQVar2 = widget;
    do {
      pQVar2 = *(QWidget **)(*(long *)&pQVar2->field_0x8 + 0x10);
      if (pQVar2 == (QWidget *)0x0) goto LAB_0031041b;
    } while (pQVar2->data->winid == 0);
    lVar1 = *(long *)(*(long *)&pQVar2->field_0x8 + 0x78);
    if (lVar1 == 0) {
      lVar1 = 0;
    }
    else {
      lVar1 = *(long *)(lVar1 + 8);
    }
    if (lVar1 == 0) {
      lVar1 = 0;
    }
    else {
      lVar1 = *(long *)(lVar1 + 0x20);
    }
  }
LAB_0031041b:
  if (lVar1 != 0) {
    if (cursor != (QCursor *)0x0) {
      mouseGrabWithCursor = 1;
      QGuiApplication::setOverrideCursor(cursor);
    }
    QWindow::setMouseGrabEnabled(SUB81(lVar1,0));
  }
  qt_mouseGrb = widget;
  return;
}

Assistant:

static void grabMouseForWidget(QWidget *widget)
#endif
{
    if (qt_mouseGrb)
        qt_mouseGrb->releaseMouse();

    mouseGrabWithCursor = false;
    if (QWindow *window = grabberWindow(widget)) {
#ifndef QT_NO_CURSOR
        if (cursor) {
            mouseGrabWithCursor = true;
            QGuiApplication::setOverrideCursor(*cursor);
        }
#endif // !QT_NO_CURSOR
        window->setMouseGrabEnabled(true);
    }

    qt_mouseGrb = widget;
}